

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-posix.cpp
# Opt level: O2

void __thiscall Dashel::FileStream::FileStream(FileStream *this,void **vtt,string *targetName)

{
  _func_int **pp_Var1;
  bool bVar2;
  int iVar3;
  string *psVar4;
  DashelException *pDVar5;
  int *piVar6;
  string name;
  string mode;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string errorMessage;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"file",(allocator<char> *)&mode);
  FileDescriptorStream::FileDescriptorStream(&this->super_FileDescriptorStream,vtt + 1,&name);
  std::__cxx11::string::~string((string *)&name);
  pp_Var1 = (_func_int **)*vtt;
  (this->super_FileDescriptorStream).super_DisconnectableStream.super_SelectableStream.
  _vptr_SelectableStream = pp_Var1;
  *(void **)((long)&(this->super_FileDescriptorStream).super_DisconnectableStream.
                    super_SelectableStream._vptr_SelectableStream + (long)pp_Var1[-3]) = vtt[7];
  ParameterSet::add((ParameterSet *)
                    (&(this->super_FileDescriptorStream).super_DisconnectableStream.
                      super_SelectableStream.field_0x30 +
                    (long)(this->super_FileDescriptorStream).super_DisconnectableStream.
                          super_SelectableStream._vptr_SelectableStream[-3]),
                    "file:name;mode=read;fd=-1");
  ParameterSet::add((ParameterSet *)
                    (&(this->super_FileDescriptorStream).super_DisconnectableStream.
                      super_SelectableStream.field_0x30 +
                    (long)(this->super_FileDescriptorStream).super_DisconnectableStream.
                          super_SelectableStream._vptr_SelectableStream[-3]),
                    (targetName->_M_dataplus)._M_p);
  iVar3 = ParameterSet::get<int>
                    ((ParameterSet *)
                     (&(this->super_FileDescriptorStream).super_DisconnectableStream.
                       super_SelectableStream.field_0x30 +
                     (long)(this->super_FileDescriptorStream).super_DisconnectableStream.
                           super_SelectableStream._vptr_SelectableStream[-3]),"fd");
  (this->super_FileDescriptorStream).super_DisconnectableStream.super_SelectableStream.fd = iVar3;
  if (-1 < iVar3) {
    ParameterSet::erase((ParameterSet *)
                        (&(this->super_FileDescriptorStream).super_DisconnectableStream.
                          super_SelectableStream.field_0x30 +
                        (long)(this->super_FileDescriptorStream).super_DisconnectableStream.
                              super_SelectableStream._vptr_SelectableStream[-3]),"fd");
    return;
  }
  psVar4 = ParameterSet::get_abi_cxx11_
                     ((ParameterSet *)
                      (&(this->super_FileDescriptorStream).super_DisconnectableStream.
                        super_SelectableStream.field_0x30 +
                      (long)(this->super_FileDescriptorStream).super_DisconnectableStream.
                            super_SelectableStream._vptr_SelectableStream[-3]),"name");
  std::__cxx11::string::string((string *)&name,(string *)psVar4);
  psVar4 = ParameterSet::get_abi_cxx11_
                     ((ParameterSet *)
                      (&(this->super_FileDescriptorStream).super_DisconnectableStream.
                        super_SelectableStream.field_0x30 +
                      (long)(this->super_FileDescriptorStream).super_DisconnectableStream.
                            super_SelectableStream._vptr_SelectableStream[-3]),"mode");
  std::__cxx11::string::string((string *)&mode,(string *)psVar4);
  bVar2 = std::operator==(&mode,"read");
  if (bVar2) {
    iVar3 = open(name._M_dataplus._M_p,0);
  }
  else {
    bVar2 = std::operator==(&mode,"write");
    if (bVar2) {
      iVar3 = creat(name._M_dataplus._M_p,0x1b0);
      (this->super_FileDescriptorStream).super_DisconnectableStream.super_SelectableStream.fd =
           iVar3;
      (this->super_FileDescriptorStream).super_DisconnectableStream.super_SelectableStream.writeOnly
           = true;
      goto LAB_001186d7;
    }
    bVar2 = std::operator==(&mode,"readwrite");
    if (!bVar2) {
      pDVar5 = (DashelException *)__cxa_allocate_exception(0x20);
      DashelException::DashelException(pDVar5,InvalidTarget,0,"Invalid file mode.",(Stream *)0x0);
      __cxa_throw(pDVar5,&DashelException::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar3 = open(name._M_dataplus._M_p,2);
  }
  (this->super_FileDescriptorStream).super_DisconnectableStream.super_SelectableStream.fd = iVar3;
LAB_001186d7:
  if (iVar3 != -1) {
    std::__cxx11::string::~string((string *)&mode);
    std::__cxx11::string::~string((string *)&name);
    return;
  }
  std::operator+(&local_a0,"Cannot open file ",&name);
  std::operator+(&local_80,&local_a0," for ");
  std::operator+(&local_60,&local_80,&mode);
  std::operator+(&errorMessage,&local_60,".");
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  pDVar5 = (DashelException *)__cxa_allocate_exception(0x20);
  piVar6 = __errno_location();
  DashelException::DashelException
            (pDVar5,ConnectionFailed,*piVar6,errorMessage._M_dataplus._M_p,(Stream *)0x0);
  __cxa_throw(pDVar5,&DashelException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

explicit FileStream(const string& targetName) :
			Stream("file"),
			FileDescriptorStream("file")
		{
			target.add("file:name;mode=read;fd=-1");
			target.add(targetName.c_str());
			fd = target.get<int>("fd");
			if (fd < 0)
			{
				const std::string name = target.get("name");
				const std::string mode = target.get("mode");

				// open file
				if (mode == "read")
					fd = open(name.c_str(), O_RDONLY);
				else if (mode == "write")
					fd = creat(name.c_str(), S_IRUSR | S_IWUSR | S_IRGRP | S_IWGRP), writeOnly = true;
				else if (mode == "readwrite")
					fd = open(name.c_str(), O_RDWR);
				else
					throw DashelException(DashelException::InvalidTarget, 0, "Invalid file mode.");
				if (fd == -1)
				{
					string errorMessage = "Cannot open file " + name + " for " + mode + ".";
					throw DashelException(DashelException::ConnectionFailed, errno, errorMessage.c_str());
				}
			}
			else
			{
				// remove file descriptor information from target name
				target.erase("fd");
			}
		}